

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int constfolding(FuncState *fs,int op,expdesc *e1,expdesc *e2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Value VVar4;
  TValue res;
  TValue v2;
  TValue v1;
  Value local_58;
  int local_50;
  Value local_48;
  int local_40;
  Value local_38;
  undefined4 local_30;
  
  if (e1->t != e1->f) {
    return 0;
  }
  if (e1->k == VKINT) {
    local_30 = 0x13;
    bVar3 = true;
  }
  else {
    if (e1->k != VKFLT) {
      return 0;
    }
    local_30 = 3;
    bVar3 = false;
  }
  local_38 = (Value)(e1->u).nval;
  if (e2->t != e2->f) {
    return 0;
  }
  if (e2->k == VKINT) {
    local_40 = 0x13;
    bVar1 = true;
  }
  else {
    if (e2->k != VKFLT) {
      return 0;
    }
    local_40 = 3;
    bVar1 = false;
  }
  local_48 = (Value)(e2->u).nval;
  if (0xd < (uint)op) goto LAB_001072dd;
  if ((0x2f80U >> (op & 0x1fU) & 1) == 0) {
    if ((0x68U >> (op & 0x1fU) & 1) == 0) goto LAB_001072dd;
    VVar4 = local_48;
    if (bVar1) {
      VVar4.n = (lua_Number)local_48.i;
    }
    bVar3 = VVar4.n != 0.0;
  }
  else {
    VVar4 = local_38;
    if (!bVar3) {
      bVar3 = false;
      iVar2 = luaV_tointeger((TValue *)&local_38,&local_58.i,0);
      VVar4 = local_58;
      if (iVar2 == 0) goto LAB_001072d8;
    }
    local_58 = VVar4;
    bVar3 = true;
    if (local_40 != 0x13) {
      iVar2 = luaV_tointeger((TValue *)&local_48,&local_58.i,0);
      bVar3 = iVar2 != 0;
    }
  }
LAB_001072d8:
  if (!bVar3) {
    return 0;
  }
LAB_001072dd:
  luaO_arith(fs->ls->L,op,(TValue *)&local_38,(TValue *)&local_48,(TValue *)&local_58);
  if (local_50 == 0x13) {
    e1->k = VKINT;
    (e1->u).nval = (lua_Number)local_58;
  }
  else {
    if (local_58.n == 0.0) {
      return 0;
    }
    e1->k = VKFLT;
    (e1->u).nval = (lua_Number)local_58;
  }
  return 1;
}

Assistant:

static int constfolding (FuncState *fs, int op, expdesc *e1,
                                                const expdesc *e2) {
  TValue v1, v2, res;
  if (!tonumeral(e1, &v1) || !tonumeral(e2, &v2) || !validop(op, &v1, &v2))
    return 0;  /* non-numeric operands or not safe to fold */
  luaO_arith(fs->ls->L, op, &v1, &v2, &res);  /* does operation */
  if (ttisinteger(&res)) {
    e1->k = VKINT;
    e1->u.ival = ivalue(&res);
  }
  else {  /* folds neither NaN nor 0.0 (to avoid problems with -0.0) */
    lua_Number n = fltvalue(&res);
    if (luai_numisnan(n) || n == 0)
      return 0;
    e1->k = VKFLT;
    e1->u.nval = n;
  }
  return 1;
}